

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  ostream *poVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  int iVar5;
  TablePrinter *pTVar6;
  long lVar7;
  allocator_type *paVar8;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l_00;
  undefined1 auVar9 [16];
  size_type __dnew;
  allocator_type *local_110;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  local_108;
  ColumnInfo local_e8;
  allocator_type **local_b8;
  allocator_type *local_b0;
  allocator_type *local_a8;
  undefined4 local_a0;
  undefined1 local_9c;
  undefined8 local_98;
  undefined4 local_90;
  allocator_type **local_88;
  allocator_type *local_80;
  allocator_type *local_78;
  undefined4 local_70;
  undefined1 local_6c;
  undefined8 local_68;
  undefined4 local_60;
  allocator_type *local_58;
  allocator_type *local_50;
  allocator_type *local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  undefined4 local_30;
  
  ReporterBase::ReporterBase((ReporterBase *)this,config);
  (this->super_StreamingReporterBase).currentTestRunInfo.name.m_start =
       "test run has not started yet";
  (this->super_StreamingReporterBase).currentTestRunInfo.name.m_size = 0x1c;
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__ConsoleReporter_00321768;
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  iVar5 = (*config->m_fullConfig->_vptr_IConfig[0x18])();
  if ((char)iVar5 == '\0') {
    local_e8.name._M_dataplus._M_p = (pointer)&local_e8.name.field_2;
    local_e8.name.field_2._M_allocated_capacity._0_6_ = 0x6d68636e6562;
    local_e8.name.field_2._M_allocated_capacity._6_2_ = 0x7261;
    local_e8.name.field_2._8_6_ = 0x656d616e206b;
    local_e8.name._M_string_length = 0xe;
    local_e8.name.field_2._M_local_buf[0xe] = '\0';
    local_e8.width = 0x25;
    local_e8.justification = Left;
    local_b8 = &local_a8;
    local_110 = (allocator_type *)0x1f;
    local_b8 = (allocator_type **)
               std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_110);
    local_a8 = local_110;
    builtin_strncpy((char *)((long)local_b8 + 0xf),"an      ",8);
    builtin_strncpy((char *)((long)local_b8 + 0x17)," std dev",8);
    *local_b8 = (allocator_type *)0x2073656c706d6173;
    local_b8[1] = (allocator_type *)0x61656d2020202020;
    local_b0 = local_110;
    *(allocator_type *)((long)local_b8 + (long)local_110) = (allocator_type)0x0;
    local_98 = 0xe;
    local_90 = 1;
    local_88 = &local_78;
    local_110 = (allocator_type *)0x23;
    local_88 = (allocator_type **)
               std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_110);
    local_78 = local_110;
    local_88[2] = (allocator_type *)0x2020206e61656d20;
    local_88[3] = (allocator_type *)0x2064747320776f6c;
    *local_88 = (allocator_type *)0x6f69746172657469;
    local_88[1] = (allocator_type *)0x776f6c202020736e;
    builtin_strncpy((char *)((long)local_88 + 0x1f)," dev",4);
    local_80 = local_110;
    *(allocator_type *)((long)local_88 + (long)local_110) = (allocator_type)0x0;
    local_68 = 0xe;
    local_60 = 1;
    paVar8 = (allocator_type *)&local_48;
    local_110 = (allocator_type *)0x24;
    local_58 = paVar8;
    auVar9 = std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_110);
    __l_00._M_len = auVar9._8_8_;
    local_58 = auVar9._0_8_;
    local_48 = local_110;
    *(undefined8 *)(local_58 + 0x10) = 0x20206e61656d2068;
    *(undefined8 *)(local_58 + 0x18) = 0x6474732068676968;
    *(undefined8 *)local_58 = 0x6574616d69747365;
    *(undefined8 *)(local_58 + 8) = 0x6769682020202064;
    *(undefined4 *)(local_58 + 0x20) = 0x76656420;
    local_50 = local_110;
    local_58[(long)local_110] = (allocator_type)0x0;
    local_38 = 0xe;
    local_30 = 1;
    __l_00._M_array = &local_e8;
    std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_108,__l_00,local_110);
    lVar7 = -0xc0;
    do {
      if (paVar8 != *(allocator_type **)(paVar8 + -0x10)) {
        operator_delete(*(allocator_type **)(paVar8 + -0x10),(ulong)(*(allocator_type **)paVar8 + 1)
                       );
      }
      paVar8 = paVar8 + -0x30;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0);
  }
  else {
    local_e8.name._M_dataplus._M_p = (pointer)&local_e8.name.field_2;
    local_e8.name.field_2._M_allocated_capacity._0_6_ = 0x6d68636e6562;
    local_e8.name.field_2._M_allocated_capacity._6_2_ = 0x7261;
    local_e8.name.field_2._8_6_ = 0x656d616e206b;
    local_e8.name._M_string_length = 0xe;
    local_e8.name.field_2._M_local_buf[0xe] = '\0';
    local_e8.width = 0x25;
    local_e8.justification = Left;
    local_b8 = &local_a8;
    local_a8 = (allocator_type *)0x6d61732020202020;
    local_a0 = 0x73656c70;
    local_b0 = (allocator_type *)0xc;
    local_9c = 0;
    local_98 = 0xe;
    local_90 = 1;
    local_88 = &local_78;
    local_78 = (allocator_type *)0x7461726574692020;
    local_70 = 0x736e6f69;
    local_80 = (allocator_type *)0xc;
    local_6c = 0;
    local_68 = 0xe;
    local_60 = 1;
    paVar8 = (allocator_type *)&local_48;
    local_48 = (allocator_type *)0x2020202020202020;
    local_40 = 0x6e61656d;
    local_50 = (allocator_type *)0xc;
    local_3c = 0;
    local_38 = 0xe;
    local_30 = 1;
    __l._M_len = 0x2020202020202020;
    __l._M_array = &local_e8;
    local_58 = paVar8;
    std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_108,__l,(allocator_type *)0x0);
    lVar7 = -0xc0;
    do {
      if (paVar8 != *(allocator_type **)(paVar8 + -0x10)) {
        operator_delete(*(allocator_type **)(paVar8 + -0x10),(ulong)(*(allocator_type **)paVar8 + 1)
                       );
      }
      paVar8 = paVar8 + -0x30;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0);
  }
  pTVar6 = (TablePrinter *)operator_new(0x38);
  pCVar4 = local_108.
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pCVar3 = local_108.
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = local_108.
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_108.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar6->m_os = poVar1;
  (pTVar6->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = pCVar2;
  (pTVar6->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar3;
  (pTVar6->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar4;
  local_e8.name.field_2._M_allocated_capacity._0_6_ = 0;
  local_e8.name.field_2._M_allocated_capacity._6_2_ = 0;
  local_e8.name._M_dataplus._M_p = (pointer)0x0;
  local_e8.name._M_string_length = 0;
  ReusableStringStream::ReusableStringStream(&pTVar6->m_oss);
  pTVar6->m_currentColumn = -1;
  pTVar6->m_isOpen = false;
  (this->m_tablePrinter).m_ptr = pTVar6;
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             *)&local_e8);
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(&local_108);
  this->m_headerPrinted = false;
  this->m_testRunInfoPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig&& config):
    StreamingReporterBase( CATCH_MOVE( config ) ),
    m_tablePrinter(Detail::make_unique<TablePrinter>(m_stream,
        [&config]() -> std::vector<ColumnInfo> {
        if (config.fullConfig()->benchmarkNoAnalysis())
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                { "     samples", 14, Justification::Right },
                { "  iterations", 14, Justification::Right },
                { "        mean", 14, Justification::Right }
            };
        }
        else
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                { "samples      mean       std dev", 14, Justification::Right },
                { "iterations   low mean   low std dev", 14, Justification::Right },
                { "estimated    high mean  high std dev", 14, Justification::Right }
            };
        }
    }())) {}